

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void gimage::anon_unknown_6::readUnpacked<float>
               (float *ret,uint32_t n,TiffImage<float> *tif,uint32_t row,uint16_t sample)

{
  uint16_t uVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  IOException *pIVar5;
  long *plVar6;
  byte *pbVar7;
  size_type *psVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar3 = (ulong)n;
  if ((((tif->bits == 0x20) && (tif->is_float != false)) && (tif->raw_size <= uVar3 << 2)) &&
     (tif->photometric != 0)) {
    iVar4 = TIFFReadScanline(tif->tif,ret,row,sample);
    if (iVar4 < 0) {
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_68,row);
      std::operator+(&local_48,"Cannot read row ",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      gutil::IOException::IOException(pIVar5,&local_88);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&tif->raw,tif->raw_size);
    iVar4 = TIFFReadScanline(tif->tif,(tif->raw).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,row,sample);
    if (iVar4 < 0) {
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_68,row);
      std::operator+(&local_48,"Cannot read row ",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      gutil::IOException::IOException(pIVar5,&local_88);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    uVar1 = tif->bits;
    if (tif->is_float == true) {
      if (uVar1 == 0x40) {
        puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = (float)(1.0 - *(double *)(puVar2 + uVar9 * 8));
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            ret[uVar9] = (float)*(double *)(puVar2 + uVar9 * 8);
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
      }
      else {
        if (uVar1 != 0x20) {
          pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_68,(uint)tif->bits);
          std::operator+(&local_48,"Cannot convert TIFF image with ",&local_68);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
          local_88._M_dataplus._M_p = (pointer)*plVar6;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
            local_88.field_2._M_allocated_capacity = *psVar8;
            local_88.field_2._8_8_ = plVar6[3];
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          }
          else {
            local_88.field_2._M_allocated_capacity = *psVar8;
          }
          local_88._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          gutil::IOException::IOException(pIVar5,&local_88);
          __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = 1.0 - *(float *)(puVar2 + uVar9 * 4);
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            ret[uVar9] = *(float *)(puVar2 + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
      }
    }
    else {
      switch(uVar1) {
      case 1:
        pbVar7 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              fVar11 = 1.0;
              if ((char)*pbVar7 < '\0') {
                fVar11 = 0.0;
              }
              uVar10 = uVar9 + 1;
              ret[uVar9] = fVar11;
              if (uVar10 < uVar3) {
                ret[uVar9 + 1] = (float)((*pbVar7 & 0x40) == 0);
                uVar10 = uVar9 + 2;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((*pbVar7 & 0x20) == 0);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((*pbVar7 & 0x10) == 0);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((*pbVar7 & 8) == 0);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((*pbVar7 & 4) == 0);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((*pbVar7 & 2) == 0);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)(~*pbVar7 & 1);
                uVar10 = uVar10 + 1;
              }
              pbVar7 = pbVar7 + 1;
              uVar9 = uVar10;
            } while (uVar10 < uVar3);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            uVar10 = uVar9 + 1;
            ret[uVar9] = (float)(*pbVar7 >> 7);
            if (uVar10 < uVar3) {
              ret[uVar9 + 1] = (float)(*pbVar7 >> 6 & 1);
              uVar10 = uVar9 + 2;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 5 & 1);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 4 & 1);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 3 & 1);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 2 & 1);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 1 & 1);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 & 1);
              uVar10 = uVar10 + 1;
            }
            pbVar7 = pbVar7 + 1;
            uVar9 = uVar10;
          } while (uVar10 < uVar3);
        }
        break;
      case 2:
        pbVar7 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              uVar10 = uVar9 + 1;
              ret[uVar9] = (float)((byte)~*pbVar7 >> 6);
              if (uVar10 < uVar3) {
                ret[uVar9 + 1] = (float)((byte)~*pbVar7 >> 4 & 3);
                uVar10 = uVar9 + 2;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)((byte)~*pbVar7 >> 2 & 3);
                uVar10 = uVar10 + 1;
              }
              if (uVar10 < uVar3) {
                ret[uVar10] = (float)(~*pbVar7 & 3);
                uVar10 = uVar10 + 1;
              }
              pbVar7 = pbVar7 + 1;
              uVar9 = uVar10;
            } while (uVar10 < uVar3);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            uVar10 = uVar9 + 1;
            ret[uVar9] = (float)(*pbVar7 >> 6);
            if (uVar10 < uVar3) {
              ret[uVar9 + 1] = (float)(*pbVar7 >> 4 & 3);
              uVar10 = uVar9 + 2;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 >> 2 & 3);
              uVar10 = uVar10 + 1;
            }
            if (uVar10 < uVar3) {
              ret[uVar10] = (float)(*pbVar7 & 3);
              uVar10 = uVar10 + 1;
            }
            pbVar7 = pbVar7 + 1;
            uVar9 = uVar10;
          } while (uVar10 < uVar3);
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_0013da58_caseD_3:
        pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_68,(uint)tif->bits);
        std::operator+(&local_48,"Cannot convert TIFF image with ",&local_68);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_88._M_dataplus._M_p = (pointer)*plVar6;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
          local_88.field_2._M_allocated_capacity = *psVar8;
          local_88.field_2._8_8_ = plVar6[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar8;
        }
        local_88._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        gutil::IOException::IOException(pIVar5,&local_88);
        __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      case 4:
        pbVar7 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = (float)((byte)~*pbVar7 >> 4);
              uVar10 = uVar9 + 1;
              if (uVar9 + 1 < uVar3) {
                ret[uVar9 + 1] = (float)(~*pbVar7 & 0xf);
                uVar10 = uVar9 + 2;
              }
              uVar9 = uVar10;
              pbVar7 = pbVar7 + 1;
            } while (uVar9 < uVar3);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            ret[uVar9] = (float)(*pbVar7 >> 4);
            uVar10 = uVar9 + 1;
            if (uVar9 + 1 < uVar3) {
              ret[uVar9 + 1] = (float)(*pbVar7 & 0xf);
              uVar10 = uVar9 + 2;
            }
            uVar9 = uVar10;
            pbVar7 = pbVar7 + 1;
          } while (uVar9 < uVar3);
        }
        break;
      case 8:
        puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = (float)(byte)~puVar2[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
        else if (n != 0) {
          uVar9 = 0;
          do {
            ret[uVar9] = (float)puVar2[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        break;
      default:
        if (uVar1 == 0x10) {
          puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (tif->photometric == 0) {
            if (n != 0) {
              uVar9 = 0;
              do {
                ret[uVar9] = (float)(*(ushort *)(puVar2 + uVar9 * 2) ^ 0xffff);
                uVar9 = uVar9 + 1;
              } while (uVar3 != uVar9);
            }
          }
          else if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = (float)*(ushort *)(puVar2 + uVar9 * 2);
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
        else {
          if (uVar1 != 0x20) goto switchD_0013da58_caseD_3;
          puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (tif->photometric == 0) {
            if (n != 0) {
              uVar9 = 0;
              do {
                ret[uVar9] = (float)~*(uint *)(puVar2 + uVar9 * 4);
                uVar9 = uVar9 + 1;
              } while (uVar3 != uVar9);
            }
          }
          else if (n != 0) {
            uVar9 = 0;
            do {
              ret[uVar9] = (float)*(uint *)(puVar2 + uVar9 * 4);
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void readUnpacked(T *ret, uint32_t n, TiffImage<T> &tif, uint32_t row, uint16_t sample)
{
  if (tif.bits != 8*sizeof(T) || tif.is_float != std::is_floating_point<T>::value ||
    n*sizeof(T) < tif.raw_size || tif.photometric == PHOTOMETRIC_MINISWHITE)
  {
    // converting row value wise

    tif.raw.resize(tif.raw_size);

    if (TIFFReadScanline(tif.tif, tif.raw.data(), row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }

    if (tif.is_float)
    {
      if (tif.bits == 32)
      {
        float *p=reinterpret_cast<float *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0f-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 64)
      {
        double *p=reinterpret_cast<double *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit floating point type");
      }
    }
    else
    {
      if (tif.bits == 1)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(1-((*p>>7) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>6) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>5) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>4) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>3) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>2) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>1) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-(*p & 0x1));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>7) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>6) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>5) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>3) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>1) & 0x1);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x1);
            p++;
          }
        }
      }
      else if (tif.bits == 2)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(3-((*p>>6) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>4) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>2) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-(*p & 0x3));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>6) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x3);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x3);
            p++;
          }
        }
      }
      else if (tif.bits == 4)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(15-((*p>>4) & 0xf));
            if (i < n) ret[i++]=static_cast<T>(15-(*p & 0xf));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>4) & 0xf);
            if (i < n) ret[i++]=static_cast<T>(*p & 0xf);
            p++;
          }
        }
      }
      else if (tif.bits == 8)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(255-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 16)
      {
        uint16_t *p=reinterpret_cast<uint16_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(65535-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 32)
      {
        uint32_t *p=reinterpret_cast<uint32_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(4294967295-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit integer type");
      }
    }
  }
  else
  {
    if (TIFFReadScanline(tif.tif, ret, row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }
  }
}